

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O0

void readCore(string *fn,uint64_t *headerTimeAccum,uint64_t *imgDataTimeAccum,
             uint64_t *closeTimeAccum,uint64_t *pixCount)

{
  int iVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  rep rVar4;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_R8;
  exception *e;
  time_point closetime;
  time_point imgtime;
  time_point hend;
  time_point hstart;
  exr_context_initializer_t cinit;
  exr_context_t c;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffe98;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffea0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffea8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_f0;
  rep local_e8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_e0;
  rep local_d8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a0;
  undefined8 local_98;
  code *pcStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  exr_context_t f;
  undefined1 local_30 [8];
  long *local_28;
  long *local_20;
  long *local_18;
  long *local_10;
  
  local_48 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  f = (exr_context_t)0x0;
  local_98 = 0x68;
  uStack_40 = 0xbf800000fffffffe;
  pcStack_90 = error_handler_new;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_a0 = std::chrono::_V2::steady_clock::now();
  uVar2 = std::__cxx11::string::c_str();
  iVar1 = exr_start_read(local_30,uVar2,&local_98);
  if (iVar1 == 0) {
    local_b8 = std::chrono::_V2::steady_clock::now();
    uVar3 = read_pixels_raw(f);
    *local_28 = *local_28 + uVar3;
    local_c0 = std::chrono::_V2::steady_clock::now();
    exr_finish(local_30);
    local_c8 = std::chrono::_V2::steady_clock::now();
    local_d8 = (rep)std::chrono::operator-(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    local_d0.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                  (in_stack_fffffffffffffe98);
    rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_d0);
    *local_10 = *local_10 + rVar4;
    local_e8 = (rep)std::chrono::operator-(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    local_e0.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                  (in_stack_fffffffffffffe98);
    rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_e0);
    *local_18 = *local_18 + rVar4;
    std::chrono::operator-(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    local_f0.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                  (in_stack_fffffffffffffe98);
    rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_f0);
    *local_20 = rVar4 + *local_20;
  }
  return;
}

Assistant:

static void
readCore (
    const std::string& fn,
    uint64_t&          headerTimeAccum,
    uint64_t&          imgDataTimeAccum,
    uint64_t&          closeTimeAccum,
    uint64_t&          pixCount)
{
    try
    {
        exr_context_t             c;
        exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;

        cinit.error_handler_fn = &error_handler_new;

        auto hstart = std::chrono::steady_clock::now ();
        if (EXR_ERR_SUCCESS == exr_start_read (&c, fn.c_str (), &cinit))
        {
            auto hend = std::chrono::steady_clock::now ();
            pixCount += read_pixels_raw (c);
            auto imgtime = std::chrono::steady_clock::now ();
            exr_finish (&c);
            auto closetime = std::chrono::steady_clock::now ();
            headerTimeAccum +=
                std::chrono::duration_cast<std::chrono::nanoseconds> (
                    hend - hstart)
                    .count ();
            imgDataTimeAccum +=
                std::chrono::duration_cast<std::chrono::nanoseconds> (
                    imgtime - hend)
                    .count ();
            closeTimeAccum +=
                std::chrono::duration_cast<std::chrono::nanoseconds> (
                    closetime - imgtime)
                    .count ();
        }
    }
    catch (std::exception& e)
    {
        std::cerr << "readCore: " << e.what () << std::endl;
        throw;
    }
}